

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setPartials
          (BeagleCPUImpl<double,_1,_0> *this,int bufferIndex,double *inPartials)

{
  int iVar1;
  int iVar2;
  double **ppdVar3;
  int k;
  int iVar4;
  double *pdVar5;
  uint uVar6;
  int iVar7;
  int l;
  int iVar8;
  int i;
  int iVar9;
  bool bVar10;
  
  iVar7 = -5;
  if ((-1 < bufferIndex) && (bufferIndex < *(int *)&(this->super_BeagleImpl).field_0xc)) {
    ppdVar3 = this->gPartials;
    pdVar5 = ppdVar3[(uint)bufferIndex];
    if (pdVar5 == (double *)0x0) {
      pdVar5 = (double *)malloc((long)this->kPartialsSize << 3);
      ppdVar3[(uint)bufferIndex] = pdVar5;
      pdVar5 = this->gPartials[(uint)bufferIndex];
      if (pdVar5 == (double *)0x0) {
        return -2;
      }
    }
    iVar7 = 0;
    for (iVar8 = 0; iVar8 < this->kCategoryCount; iVar8 = iVar8 + 1) {
      for (iVar9 = 0; iVar9 < this->kPatternCount; iVar9 = iVar9 + 1) {
        memcpy(pdVar5,inPartials,(ulong)(uint)this->kStateCount << 3);
        iVar1 = this->kStateCount;
        iVar2 = this->kPartialsPaddedStateCount;
        pdVar5 = pdVar5 + iVar1;
        for (iVar4 = iVar1; iVar4 < iVar2; iVar4 = iVar4 + 1) {
          *pdVar5 = 0.0;
          pdVar5 = pdVar5 + 1;
        }
        inPartials = inPartials + iVar1;
      }
      uVar6 = (this->kPaddedPatternCount - this->kPatternCount) * this->kPartialsPaddedStateCount;
      uVar6 = ~((int)uVar6 >> 0x1f) & uVar6;
      while (bVar10 = uVar6 != 0, uVar6 = uVar6 - 1, bVar10) {
        *pdVar5 = 0.0;
        pdVar5 = pdVar5 + 1;
      }
    }
  }
  return iVar7;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setPartials(int bufferIndex,
                               const double* inPartials) {
    if (bufferIndex < 0 || bufferIndex >= kBufferCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    if (gPartials[bufferIndex] == NULL) {
        gPartials[bufferIndex] = (REALTYPE*) malloc(sizeof(REALTYPE) * kPartialsSize);
        if (gPartials[bufferIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }

    const double* inPartialsOffset = inPartials;
    REALTYPE* tmpRealPartialsOffset = gPartials[bufferIndex];
    for (int l = 0; l < kCategoryCount; l++) {
        for (int i = 0; i < kPatternCount; i++) {
            beagleMemCpy(tmpRealPartialsOffset, inPartialsOffset, kStateCount);
            tmpRealPartialsOffset += kStateCount;
            // Pad extra buffer with zeros
            for(int k = kStateCount; k < kPartialsPaddedStateCount; k++) {
                *tmpRealPartialsOffset++ = 0;
            }
            inPartialsOffset += kStateCount;
        }
        // Pad extra buffer with zeros
        for(int k = 0; k < kPartialsPaddedStateCount * (kPaddedPatternCount - kPatternCount); k++) {
            *tmpRealPartialsOffset++ = 0;
        }
    }

    return BEAGLE_SUCCESS;
}